

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O1

void __thiscall
Fl_Text_Display::find_wrap_range
          (Fl_Text_Display *this,char *deletedText,int pos,int nInserted,int nDeleted,
          int *modRangeStart,int *modRangeEnd,int *linesInserted,int *linesDeleted)

{
  uint uVar1;
  long lVar2;
  uint startPos;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  int *piVar8;
  Fl_Text_Buffer *pFVar9;
  undefined4 in_register_0000000c;
  int *retLines_00;
  int iVar10;
  ulong uVar11;
  int retLineEnd;
  int retPos;
  undefined8 local_78;
  int *local_70;
  int *local_68;
  ulong local_60;
  ulong local_58;
  int retLineStart;
  ulong local_48;
  char *local_40;
  int retLines;
  
  local_78 = CONCAT44(in_register_0000000c,nInserted);
  pFVar9 = this->mBuffer;
  uVar1 = this->mNVisibleLines;
  uVar7 = (ulong)uVar1;
  local_70 = this->mLineStarts;
  local_40 = deletedText;
  if ((pos < this->mFirstChar) || (this->mLastChar < pos)) {
LAB_001d3f0f:
    startPos = Fl_Text_Buffer::line_start(pFVar9,pos);
    uVar11 = 0;
  }
  else {
    uVar11 = (ulong)(uVar1 - 1);
    do {
      if ((int)uVar7 < 2) goto LAB_001d3f0f;
      lVar2 = uVar7 - 1;
      uVar7 = uVar7 - 1;
      uVar11 = (ulong)((int)uVar11 - 1);
    } while (pos < local_70[lVar2] || local_70[lVar2] == -1);
    startPos = local_70[uVar11];
  }
  *modRangeStart = startPos;
  uVar3 = (int)local_78 + pos;
  retLines_00 = &retLines;
  local_68 = modRangeStart;
  local_60 = (ulong)(uint)nDeleted;
  local_58 = (ulong)(uint)pos;
LAB_001d3f46:
  local_48 = (ulong)startPos;
  iVar10 = 0;
  do {
    wrapped_line_counter
              (this,pFVar9,startPos,pFVar9->mLength,1,true,0,&retPos,retLines_00,&retLineStart,
               &retLineEnd,true);
    startPos = retPos;
    iVar4 = pFVar9->mLength;
    if (iVar4 <= retPos) {
      *modRangeEnd = iVar4;
      iVar10 = iVar10 + (uint)(retPos != retLineEnd);
LAB_001d4104:
      uVar7 = local_48;
      *linesInserted = iVar10;
      if (this->mSuppressResync == 0) {
        iVar10 = (int)local_58 - (int)local_48;
        iVar6 = iVar10 + (int)local_60;
        local_78 = CONCAT44(local_78._4_4_,iVar6);
        iVar6 = (iVar4 - uVar3) + iVar6;
        pFVar9 = (Fl_Text_Buffer *)operator_new(0x88);
        Fl_Text_Buffer::Fl_Text_Buffer(pFVar9,iVar6,0x400);
        Fl_Text_Buffer::copy
                  (pFVar9,(EVP_PKEY_CTX *)this->mBuffer,(EVP_PKEY_CTX *)(uVar7 & 0xffffffff));
        if ((int)local_60 != 0) {
          Fl_Text_Buffer::insert(pFVar9,iVar10,local_40);
        }
        Fl_Text_Buffer::copy(pFVar9,(EVP_PKEY_CTX *)this->mBuffer,(EVP_PKEY_CTX *)(ulong)uVar3);
        wrapped_line_counter
                  (this,pFVar9,0,iVar6,0x7fffffff,true,(int)local_48,&retPos,retLines_00,
                   &retLineStart,&retLineEnd,false);
        Fl_Text_Buffer::~Fl_Text_Buffer(pFVar9);
        operator_delete(pFVar9,0x88);
      }
      else {
        retLines_00 = &this->mNLinesDeleted;
      }
      *linesDeleted = *retLines_00;
      this->mSuppressResync = 0;
      return;
    }
    iVar10 = iVar10 + 1;
    if ((int)uVar3 < retPos) {
      iVar4 = Fl_Text_Buffer::prev_char(pFVar9,retPos);
      uVar5 = Fl_Text_Buffer::char_at(pFVar9,iVar4);
      if (uVar5 == 10) {
        *modRangeEnd = startPos;
        iVar4 = startPos;
        goto LAB_001d4104;
      }
    }
    if (this->mSuppressResync == 0) {
      iVar4 = (int)uVar11;
      if ((int)local_58 < (int)startPos) {
        if (((int)uVar3 < (int)startPos) && (iVar4 < (int)uVar1)) {
          iVar6 = (startPos - (int)local_78) + (int)local_60;
          piVar8 = local_70 + iVar4;
          do {
            iVar4 = *piVar8;
            if (iVar6 <= iVar4) {
              if (iVar4 == iVar6 && iVar4 != -1) {
                iVar4 = line_end(this,startPos,true);
                *modRangeEnd = startPos;
                goto LAB_001d4104;
              }
              break;
            }
            uVar5 = (int)uVar11 + 1;
            uVar11 = (ulong)uVar5;
            piVar8 = piVar8 + 1;
          } while (uVar1 != uVar5);
        }
      }
      else {
        if (iVar4 < (int)uVar1) {
          piVar8 = local_70 + iVar4;
          do {
            if ((int)startPos <= *piVar8) {
              if (*piVar8 == startPos) {
                iVar4 = (int)uVar11 + 1;
                iVar10 = startPos;
                if ((iVar4 < (int)uVar1) && (local_70[iVar4] != -1)) {
                  iVar10 = Fl_Text_Buffer::prev_char(pFVar9,local_70[iVar4]);
                  if ((int)local_58 < iVar10) {
                    iVar10 = (int)local_58;
                  }
                }
                *local_68 = iVar10;
                goto LAB_001d3f46;
              }
              break;
            }
            uVar5 = (int)uVar11 + 1;
            uVar11 = (ulong)uVar5;
            piVar8 = piVar8 + 1;
          } while (uVar1 != uVar5);
        }
        iVar4 = *local_68;
        iVar6 = Fl_Text_Buffer::prev_char(pFVar9,startPos);
        if (iVar4 < iVar6) {
          iVar6 = iVar4;
        }
        *local_68 = iVar6;
      }
    }
  } while( true );
}

Assistant:

void Fl_Text_Display::find_wrap_range(const char *deletedText, int pos,
                                      int nInserted, int nDeleted,
                                      int *modRangeStart, int *modRangeEnd,
                                      int *linesInserted, int *linesDeleted) {
  IS_UTF8_ALIGNED(deletedText)
  IS_UTF8_ALIGNED2(buffer(), pos)

  int length, retPos, retLines, retLineStart, retLineEnd;
  Fl_Text_Buffer *deletedTextBuf, *buf = buffer();
  int nVisLines = mNVisibleLines;
  int *lineStarts = mLineStarts;
  int countFrom, countTo, lineStart, adjLineStart, i;
  int visLineNum = 0, nLines = 0;

  /*
   ** Determine where to begin searching: either the previous newline, or
   ** if possible, limit to the start of the (original) previous displayed
   ** line, using information from the existing line starts array
   */
  if (pos >= mFirstChar && pos <= mLastChar) {
    for (i=nVisLines-1; i>0; i--) {
      if (lineStarts[i] != -1 && pos >= lineStarts[i]) {
        break;
      }
    }
    if (i > 0) {
      countFrom = lineStarts[i-1];
      visLineNum = i-1;
    } else {
      countFrom = buf->line_start(pos);
    }
  } else {
    countFrom = buf->line_start(pos);
  }

  IS_UTF8_ALIGNED2(buf, countFrom)

  /*
   ** Move forward through the (new) text one line at a time, counting
   ** displayed lines, and looking for either a real newline, or for the
   ** line starts to re-sync with the original line starts array
   */
  lineStart = countFrom;
  *modRangeStart = countFrom;
  for (;;) {

    /* advance to the next line.  If the line ended in a real newline
     or the end of the buffer, that's far enough */
    wrapped_line_counter(buf, lineStart, buf->length(), 1, true, 0,
                         &retPos, &retLines, &retLineStart, &retLineEnd);
    if (retPos >= buf->length()) {
      countTo = buf->length();
      *modRangeEnd = countTo;
      if (retPos != retLineEnd)
        nLines++;
      break;
    } else {
      lineStart = retPos;
    }
    nLines++;
    if (lineStart > pos + nInserted && buf->char_at(buf->prev_char(lineStart)) == '\n') {
      countTo = lineStart;
      *modRangeEnd = lineStart;
      break;
    }

    /* Don't try to resync in continuous wrap mode with non-fixed font
     sizes; it would result in a chicken-and-egg dependency between
     the calculations for the inserted and the deleted lines.
     If we're in that mode, the number of deleted lines is calculated in
     advance, without resynchronization, so we shouldn't resynchronize
     for the inserted lines either. */
    if (mSuppressResync)
      continue;

    /* check for synchronization with the original line starts array
     before pos, if so, the modified range can begin later */
    if (lineStart <= pos) {
      while (visLineNum<nVisLines && lineStarts[visLineNum] < lineStart)
        visLineNum++;
      if (visLineNum < nVisLines && lineStarts[visLineNum] == lineStart) {
        countFrom = lineStart;
        nLines = 0;
        if (visLineNum+1 < nVisLines && lineStarts[visLineNum+1] != -1)
          *modRangeStart = min(pos, buf->prev_char(lineStarts[visLineNum+1]));
        else
          *modRangeStart = countFrom;
      } else
        *modRangeStart = min(*modRangeStart, buf->prev_char(lineStart));
    }

    /* check for synchronization with the original line starts array
     after pos, if so, the modified range can end early */
    else if (lineStart > pos + nInserted) {
      adjLineStart = lineStart - nInserted + nDeleted;
      while (visLineNum<nVisLines && lineStarts[visLineNum]<adjLineStart)
        visLineNum++;
      if (visLineNum < nVisLines && lineStarts[visLineNum] != -1 &&
          lineStarts[visLineNum] == adjLineStart) {
        countTo = line_end(lineStart, true);
        *modRangeEnd = lineStart;
        break;
      }
    }
  }
  *linesInserted = nLines;


  /* Count deleted lines between countFrom and countTo as the text existed
   before the modification (that is, as if the text between pos and
   pos+nInserted were replaced by "deletedText").  This extra context is
   necessary because wrapping can occur outside of the modified region
   as a result of adding or deleting text in the region. This is done by
   creating a textBuffer containing the deleted text and the necessary
   additional context, and calling the wrappedLineCounter on it.

   NOTE: This must not be done in continuous wrap mode when the font
   width is not fixed. In that case, the calculation would try
   to access style information that is no longer available (deleted
   text), or out of date (updated highlighting), possibly leading
   to completely wrong calculations and/or even crashes eventually.
   (This is not theoretical; it really happened.)

   In that case, the calculation of the number of deleted lines
   has happened before the buffer was modified (only in that case,
   because resynchronization of the line starts is impossible
   in that case, which makes the whole calculation less efficient).
   */
  if (mSuppressResync) {
    *linesDeleted = mNLinesDeleted;
    mSuppressResync = 0;
    return;
  }

  length = (pos-countFrom) + nDeleted +(countTo-(pos+nInserted));
  deletedTextBuf = new Fl_Text_Buffer(length);
  deletedTextBuf->copy(buffer(), countFrom, pos, 0);
  if (nDeleted != 0)
    deletedTextBuf->insert(pos-countFrom, deletedText);
  deletedTextBuf->copy(buffer(), pos+nInserted, countTo, pos-countFrom+nDeleted);
  /* Note that we need to take into account an offset for the style buffer:
   the deletedTextBuf can be out of sync with the style buffer. */
  wrapped_line_counter(deletedTextBuf, 0, length, INT_MAX, true, countFrom,
                       &retPos, &retLines, &retLineStart, &retLineEnd, false);
  delete deletedTextBuf;
  *linesDeleted = retLines;
  mSuppressResync = 0;
}